

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Communicator.hpp
# Opt level: O0

void __thiscall
OpenMD::Plan<OpenMD::Vector<double,_7U>_>::Plan
          (Plan<OpenMD::Vector<double,_7U>_> *this,MPI_Comm comm,int nObjects)

{
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  int in_EDX;
  undefined8 in_RSI;
  value_type_conflict2 *in_RDI;
  int i_1;
  int i;
  int nCommProcs;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_18;
  int local_14;
  undefined8 local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a8dea);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a8dfd);
  *(undefined8 *)(in_RDI + 0xe) = local_10;
  MPI_Comm_size(*(undefined8 *)(in_RDI + 0xe),&local_18);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_RDI);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)(ulong)in_stack_ffffffffffffffd0,
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_RDI);
  iVar3 = MPITraits<OpenMD::Vector<double,_7U>_>::Length();
  *in_RDI = iVar3 * local_14;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),0);
  MPI_Allgather(in_RDI,1,&ompi_mpi_int,pvVar4,1,&ompi_mpi_int,*(undefined8 *)(in_RDI + 0xe));
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),0);
  *pvVar4 = 0;
  for (iVar3 = 1; iVar3 < local_18; iVar3 = iVar3 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)(iVar3 + -1));
    iVar1 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)(iVar3 + -1));
    iVar2 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)iVar3);
    *pvVar4 = iVar1 + iVar2;
  }
  in_RDI[1] = 0;
  for (iVar3 = 0; iVar3 < local_18; iVar3 = iVar3 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)iVar3);
    in_RDI[1] = *pvVar4 + in_RDI[1];
  }
  return;
}

Assistant:

Plan<T>(MPI_Comm comm, int nObjects) : myComm(comm) {
      int nCommProcs;
      MPI_Comm_size(myComm, &nCommProcs);

      counts.resize(nCommProcs, 0);
      displacements.resize(nCommProcs, 0);

      planSize_ = MPITraits<T>::Length() * nObjects;

      MPI_Allgather(&planSize_, 1, MPI_INT, &counts[0], 1, MPI_INT, myComm);

      displacements[0] = 0;
      for (int i = 1; i < nCommProcs; i++) {
        displacements[i] = displacements[i - 1] + counts[i - 1];
      }

      size_ = 0;
      for (int i = 0; i < nCommProcs; i++) {
        size_ += counts[i];
      }
    }